

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O3

void __thiscall rw::Skin::findUsedBones(Skin *this,int32 numVertices)

{
  uint uVar1;
  int iVar2;
  int32 i;
  long lVar3;
  ulong uVar4;
  uint8 *puVar5;
  float *pfVar6;
  uint8 usedTab [256];
  char local_128 [264];
  
  puVar5 = this->indices;
  pfVar6 = this->weights;
  memset(local_128,0,0x100);
  if (numVertices != 0) {
    uVar1 = this->numWeights;
    do {
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          if ((pfVar6[uVar4] != 0.0) || (NAN(pfVar6[uVar4]))) {
            local_128[puVar5[uVar4]] = local_128[puVar5[uVar4]] + (local_128[puVar5[uVar4]] == '\0')
            ;
          }
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
      numVertices = numVertices + -1;
      puVar5 = puVar5 + 4;
      pfVar6 = pfVar6 + 4;
    } while (numVertices != 0);
  }
  this->numUsedBones = 0;
  lVar3 = 0;
  do {
    if (local_128[lVar3] != '\0') {
      iVar2 = this->numUsedBones;
      this->numUsedBones = iVar2 + 1;
      this->usedBones[iVar2] = (uint8)lVar3;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  return;
}

Assistant:

void
Skin::findUsedBones(int32 numVertices)
{
	uint8 usedTab[256];
	uint8 *indices = this->indices;
	float *weights = this->weights;
	memset(usedTab, 0, 256);
	while(numVertices--){
		for(int32 i = 0; i < this->numWeights; i++){
			if(weights[i] == 0.0f)
				continue;	// TODO: this could probably be optimized
			if(usedTab[indices[i]] == 0)
				usedTab[indices[i]]++;
		}
		indices += 4;
		weights += 4;
	}
	this->numUsedBones = 0;
	for(int32 i = 0; i < 256; i++)
		if(usedTab[i])
			this->usedBones[this->numUsedBones++] = i;
}